

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void eig(double *A,int N,double *eigre,double *eigim)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *H_00;
  double dVar4;
  double local_58;
  double cs;
  double t2;
  double t1;
  double *H;
  int n;
  int u;
  int t;
  int i;
  double *eigim_local;
  double *eigre_local;
  int N_local;
  double *A_local;
  
  H_00 = (double *)malloc((long)N * 8 * (long)N);
  iVar1 = N + -1;
  francis_iter(A,N,H_00);
  u = 0;
  while (u < iVar1) {
    if ((H_00[(u + 1) * N + u] != 0.0) || (NAN(H_00[(u + 1) * N + u]))) {
      eig2t(H_00 + (long)(u * N) + (long)u,N);
      u = u + 2;
    }
    else {
      u = u + 1;
    }
  }
  u = 0;
  while (u < iVar1) {
    iVar2 = u * N;
    iVar3 = (u + 1) * N;
    if ((H_00[iVar3 + u] != 0.0) || (NAN(H_00[iVar3 + u]))) {
      if (0.0 <= H_00[iVar2 + u + 1] * H_00[iVar3 + u]) {
        if ((H_00[iVar2 + u + 1] != 0.0) || (NAN(H_00[iVar2 + u + 1]))) {
          local_58 = sqrt(H_00[iVar3 + u] / H_00[iVar2 + u + 1]);
          local_58 = local_58 / (local_58 * local_58 + 1.0);
        }
        else {
          local_58 = 0.0;
        }
        eigre[u] = -local_58 * (H_00[iVar2 + u + 1] + H_00[iVar3 + u]) + H_00[iVar2 + u];
        eigre[u + 1] = local_58 * (H_00[iVar2 + u + 1] + H_00[iVar3 + u]) + H_00[iVar2 + u];
        eigim[u] = 0.0;
        eigim[u + 1] = 0.0;
      }
      else {
        eigre[u] = H_00[iVar2 + u];
        eigre[u + 1] = H_00[iVar3 + u + 1];
        dVar4 = sqrt(-H_00[iVar2 + u + 1] * H_00[iVar3 + u]);
        eigim[u] = dVar4;
        dVar4 = sqrt(-H_00[iVar2 + u + 1] * H_00[iVar3 + u]);
        eigim[u + 1] = -dVar4;
      }
      u = u + 2;
    }
    else {
      eigre[u] = H_00[iVar2 + u];
      eigim[u] = 0.0;
      u = u + 1;
    }
  }
  if (u == iVar1) {
    eigre[u] = H_00[N * N + -1];
    eigim[u] = 0.0;
  }
  free(H_00);
  return;
}

Assistant:

void eig(double *A,int N,double *eigre,double *eigim) {
	int i,t,u,n;
	double *H;
	double t1,t2,cs;
	H = (double*) malloc(sizeof(double) * N * N);
	n = N - 1;
	francis_iter(A,N,H);
	//mdisplay(H,N,N);
	i = 0;
	while (i < n) {
		u = i * N;
		t = (i+1)*N;
		if (H[t+i] != 0.) {
			eig2t(H+u+i,N);
			i = i +2;
		} else {
			i++;
		}
		
	}
	//mdisplay(H,N,N);
	i = 0;
	while (i < n) {
		u = i * N;
		t = (i+1)*N;
		
		if (H[t+i] != 0.) {
			if (H[u+i+1] * H[t+i] < 0.) {
				eigre[i] = H[u+i];
				eigre[i+1] = H[t+i+1];
				eigim[i] = sqrt(-H[u+i+1] * H[t+i]);
				eigim[i+1] = -sqrt(-H[u+i+1] * H[t+i]);
			} else {
				if (H[u+i+1] == 0.) {
					cs = 0.;
				} else {
					t1 = sqrt(H[t+i]/H[u+i+1]);
					t2 = t1 * t1;
					cs = t1/(1+t2);
				}
				eigre[i] = H[u+i] - cs * (H[u+i+1] + H[t+i]);
				eigre[i+1] = H[u+i] + cs * (H[u+i+1] + H[t+i]);
				eigim[i] = 0.;
				eigim[i+1] = 0.;
				
			}
			
			i= i + 2;
			
		} else {
			eigre[i] = H[u+i];
			eigim[i] = 0.;
			i++;
		}
		
	}
	
	if (i == n) {
		eigre[i] = H[N*N - 1];
		eigim[i] = 0.;
	}
	
	free(H);
}